

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall Map::printMap(Map *this)

{
  vector<Map::Continent_*,_std::allocator<Map::Continent_*>_> *this_00;
  bool bVar1;
  int iVar2;
  reference ppCVar3;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__x;
  ostream *poVar4;
  undefined1 local_b8 [8];
  string currCountryName;
  Country **j;
  iterator __end2;
  iterator __begin2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range2;
  undefined1 local_68 [8];
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> countriesInCurrContinent;
  string currContinent;
  Continent **pMapContinent;
  iterator __end1;
  iterator __begin1;
  vector<Map::Continent_*,_std::allocator<Map::Continent_*>_> *__range1;
  Map *this_local;
  
  this_00 = this->pMapContinents;
  __end1 = std::vector<Map::Continent_*,_std::allocator<Map::Continent_*>_>::begin(this_00);
  pMapContinent =
       (Continent **)std::vector<Map::Continent_*,_std::allocator<Map::Continent_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Map::Continent_**,_std::vector<Map::Continent_*,_std::allocator<Map::Continent_*>_>_>
                                *)&pMapContinent);
    if (!bVar1) break;
    ppCVar3 = __gnu_cxx::
              __normal_iterator<Map::Continent_**,_std::vector<Map::Continent_*,_std::allocator<Map::Continent_*>_>_>
              ::operator*(&__end1);
    Continent::getContinentName_abi_cxx11_
              ((string *)
               &countriesInCurrContinent.
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,*ppCVar3);
    __x = Continent::getCountriesInContinent(*ppCVar3);
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector
              ((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)local_68,__x);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             " \n\n\n ######################## \n COUNTRIES IN CONTINENT : ");
    poVar4 = std::operator<<(poVar4,(string *)
                                    &countriesInCurrContinent.
                                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar4,"\n ######################## \n");
    __end2 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin
                       ((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)local_68);
    j = (Country **)
        std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end
                  ((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)local_68);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                  *)&j);
      if (!bVar1) break;
      currCountryName.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
           ::operator*(&__end2);
      Country::getCountryName_abi_cxx11_
                ((string *)local_b8,*(Country **)currCountryName.field_2._8_8_);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_b8);
      poVar4 = std::operator<<(poVar4," is owned by player ");
      iVar2 = Country::getPlayerOwnerID(*(Country **)currCountryName.field_2._8_8_);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4," and has ");
      iVar2 = Country::getNumberOfTroops(*(Country **)currCountryName.field_2._8_8_);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      std::operator<<(poVar4," troops \n");
      std::__cxx11::string::~string((string *)local_b8);
      __gnu_cxx::
      __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
      ::operator++(&__end2);
    }
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::~vector
              ((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)local_68);
    std::__cxx11::string::~string
              ((string *)
               &countriesInCurrContinent.
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<Map::Continent_**,_std::vector<Map::Continent_*,_std::allocator<Map::Continent_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Map::printMap() {
    for (auto& pMapContinent : *this->pMapContinents) {
        std::string currContinent = pMapContinent->getContinentName();
        std::vector<Map::Country*> countriesInCurrContinent = *pMapContinent->getCountriesInContinent();
        std::cout << " \n\n\n ######################## \n COUNTRIES IN CONTINENT : " << currContinent
                  << "\n ######################## \n";
        for (auto& j : countriesInCurrContinent) {
            std::string currCountryName = j->getCountryName();
            std::cout << currCountryName << " is owned by player " << j->getPlayerOwnerID() <<" and has " << j->getNumberOfTroops() << " troops \n";
        }
    }
}